

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalPtr.hpp
# Opt level: O0

int * __thiscall BCL::GlobalPtr<int>::local(GlobalPtr<int> *this)

{
  size_t sVar1;
  size_t sVar2;
  debug_error *this_00;
  allocator<char> local_31;
  string local_30;
  GlobalPtr<int> *local_10;
  GlobalPtr<int> *this_local;
  
  sVar1 = this->rank;
  local_10 = this;
  sVar2 = BCL::rank();
  if (sVar1 != sVar2) {
    this_00 = (debug_error *)__cxa_allocate_exception(0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"calling local() on a remote GlobalPtr\n",&local_31);
    debug_error::debug_error(this_00,&local_30);
    __cxa_throw(this_00,&debug_error::typeinfo,debug_error::~debug_error);
  }
  return (int *)(smem_base_ptr + this->ptr);
}

Assistant:

T *local() const {
    if (rank != BCL::rank()) {
      BCL_DEBUG(throw debug_error("calling local() on a remote GlobalPtr\n"));
      return nullptr;
    } else {
      return (T *) (((char *) BCL::smem_base_ptr) + ptr);
    }
  }